

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O3

void asmjit::_SetBits(size_t *buf,size_t index,size_t len)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong *__s;
  ulong uVar5;
  
  if (len != 0) {
    uVar4 = (uint)index & 0x3f;
    uVar2 = 0x40 - (ulong)uVar4;
    if (len <= uVar2) {
      uVar2 = len;
    }
    puVar1 = buf + (index >> 6);
    __s = puVar1 + 1;
    *puVar1 = *puVar1 | (0xffffffffffffffffU >> (-(char)uVar2 & 0x3fU)) << (sbyte)uVar4;
    uVar3 = len - uVar2;
    if (0x3f < uVar3) {
      uVar2 = (len - uVar2) - 0x40;
      uVar5 = uVar2 >> 6;
      memset(__s,0xff,uVar5 * 8 + 8);
      uVar3 = (ulong)((uint)uVar2 & 0x3f);
      __s = buf + (index >> 6) + uVar5 + 2;
    }
    if (uVar3 != 0) {
      *__s = *__s | 0xffffffffffffffffU >> (-(char)uVar3 & 0x3fU);
    }
  }
  return;
}

Assistant:

static void _SetBits(size_t* buf, size_t index, size_t len) noexcept {
  if (len == 0)
    return;

  size_t i = index / kBitsPerEntity; // size_t[]
  size_t j = index % kBitsPerEntity; // size_t[][] bit index

  // How many bytes process in the first group.
  size_t c = kBitsPerEntity - j;
  if (c > len)
    c = len;

  // Offset.
  buf += i;

  *buf++ |= ((~(size_t)0) >> (kBitsPerEntity - c)) << j;
  len -= c;

  while (len >= kBitsPerEntity) {
    *buf++ = ~(size_t)0;
    len -= kBitsPerEntity;
  }

  if (len)
    *buf |= ((~(size_t)0) >> (kBitsPerEntity - len));
}